

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O0

void do_buy(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  __type_conflict2 _Var2;
  double dVar3;
  string_view fmt;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  char (*pacVar10) [4608];
  char *pcVar11;
  CHAR_DATA *pCVar12;
  char *in_RSI;
  CHAR_DATA *in_RDI;
  float fVar13;
  float fVar14;
  float mcost_1;
  bool appraised_1;
  int count;
  int number;
  char buf_1 [4608];
  char arg_1 [4608];
  OBJ_DATA *c_obj;
  OBJ_DATA *d_obj;
  OBJ_DATA *t_obj;
  OBJ_DATA *obj;
  CHAR_DATA *keeper;
  string buffer;
  float mcost;
  bool appraised;
  ROOM_INDEX_DATA *in_room;
  ROOM_INDEX_DATA *pRoomIndexNext;
  CHAR_DATA *pet;
  char buf [4608];
  char arg [4608];
  int i;
  long cost;
  int roll;
  undefined4 in_stack_ffffffffffffb5d8;
  float in_stack_ffffffffffffb5dc;
  CHAR_DATA *in_stack_ffffffffffffb5e0;
  OBJ_DATA *obj_00;
  undefined4 in_stack_ffffffffffffb5e8;
  float in_stack_ffffffffffffb5ec;
  int in_stack_ffffffffffffb5f0;
  undefined4 in_stack_ffffffffffffb5f4;
  undefined4 in_stack_ffffffffffffb5f8;
  undefined4 in_stack_ffffffffffffb5fc;
  undefined4 in_stack_ffffffffffffb608;
  undefined4 in_stack_ffffffffffffb60c;
  CHAR_DATA *in_stack_ffffffffffffb610;
  CHAR_DATA *in_stack_ffffffffffffb618;
  char (**ppacVar15) [4608];
  size_t in_stack_ffffffffffffb620;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char[4608]>
  *__return_storage_ptr__;
  char *in_stack_ffffffffffffb628;
  bool local_49b1;
  int local_49b0;
  int local_49ac;
  CHAR_DATA *in_stack_ffffffffffffb658;
  CHAR_DATA *in_stack_ffffffffffffb660;
  int in_stack_ffffffffffffb68c;
  OBJ_INDEX_DATA *in_stack_ffffffffffffb690;
  undefined4 in_stack_ffffffffffffb6b0;
  int in_stack_ffffffffffffb6b4;
  undefined1 in_stack_ffffffffffffb6bb;
  int in_stack_ffffffffffffb6bc;
  CHAR_DATA *in_stack_ffffffffffffb6c0;
  int in_stack_ffffffffffffb6dc;
  CHAR_DATA *in_stack_ffffffffffffb6e0;
  format_args in_stack_ffffffffffffb840;
  string_view in_stack_ffffffffffffb850;
  char *in_stack_ffffffffffffc7e0;
  CHAR_DATA *in_stack_ffffffffffffc7e8;
  char *in_stack_ffffffffffffc7f8;
  CHAR_DATA *in_stack_ffffffffffffc800;
  CHAR_DATA *in_stack_ffffffffffffc808;
  char *in_stack_ffffffffffffc960;
  CHAR_DATA *in_stack_ffffffffffffc968;
  OBJ_DATA *local_25a0;
  OBJ_DATA *local_2590;
  OBJ_DATA *local_2588;
  char (*local_2568) [4608];
  undefined8 local_2560;
  string local_2558 [32];
  float local_2538;
  byte local_2531;
  ROOM_INDEX_DATA *local_2520;
  ROOM_INDEX_DATA *local_2518;
  CHAR_DATA *local_2510;
  char local_2508 [4512];
  char *in_stack_ffffffffffffec98;
  CHAR_DATA *in_stack_ffffffffffffeca0;
  char local_1308 [4620];
  int local_fc;
  long local_f8;
  int local_ec;
  char *local_e8;
  CHAR_DATA *local_e0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char[4608]>
  local_d8;
  undefined8 local_b8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char[4608]>
  *local_b0;
  char (*local_a8) [4608];
  char **local_98;
  char **local_90;
  char (*local_88) [4608];
  undefined8 uStack_80;
  string *local_78;
  char *local_70;
  char (**local_68) [4608];
  char *local_60;
  char (**local_58) [4608];
  char (**local_50) [4608];
  char (*local_48) [4608];
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char[4608]>
  *local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char[4608]>
  *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char[4608]>
  *local_10;
  char *local_8;
  
  local_e8 = in_RSI;
  local_e0 = in_RDI;
  bVar4 = check_horde(in_RDI);
  if (bVar4) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffb5f4,in_stack_ffffffffffffb5f0),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8));
    return;
  }
  if (*local_e8 == '\0') {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffb5f4,in_stack_ffffffffffffb5f0),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8));
    return;
  }
  uVar1 = local_e0->in_room->room_flags[0];
  _Var2 = std::pow<int,int>(0,0x57bc46);
  if ((uVar1 & (long)_Var2) == 0) {
    local_49ac = 1;
    local_49b0 = 1;
    pCVar12 = find_keeper((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8)
                         );
    if (pCVar12 == (CHAR_DATA *)0x0) {
      return;
    }
    if (pCVar12 == local_e0) {
      return;
    }
    local_e8 = one_argument((char *)in_stack_ffffffffffffb5e0,
                            (char *)CONCAT44(in_stack_ffffffffffffb5dc,in_stack_ffffffffffffb5d8));
    if (*local_e8 != '\0') {
      local_49ac = atoi(local_e8);
    }
    local_2588 = get_obj_keeper(in_stack_ffffffffffffc808,in_stack_ffffffffffffc800,
                                in_stack_ffffffffffffc7f8);
    local_f8 = get_cost((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5fc,in_stack_ffffffffffffb5f8),
                        (OBJ_DATA *)CONCAT44(in_stack_ffffffffffffb5f4,in_stack_ffffffffffffb5f0),
                        SUB41((uint)in_stack_ffffffffffffb5ec >> 0x18,0));
    if (local_49ac < 1) {
      interpret((CHAR_DATA *)arg_1._4296_8_,(char *)arg_1._4288_8_);
      return;
    }
    if (9 < local_49ac) {
      do_say(in_stack_ffffffffffffc968,in_stack_ffffffffffffc960);
      return;
    }
    if ((local_f8 < 1) ||
       (bVar4 = can_see_obj(in_stack_ffffffffffffb618,(OBJ_DATA *)in_stack_ffffffffffffb610), !bVar4
       )) {
      sprintf(&stack0xffffffffffffb658,
              "%s I don\'t sell that, try \'list\'ing to see what I do sell.",local_e0->name);
      do_tell(in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98);
      return;
    }
    bVar4 = is_obj_stat((OBJ_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8),
                        (int)((ulong)in_stack_ffffffffffffb5e0 >> 0x20));
    if (!bVar4) {
      local_2590 = local_2588->next_content;
      while (((local_49b0 < local_49ac && local_2590 != (OBJ_DATA *)0x0 &&
              (local_2590->pIndexData == local_2588->pIndexData)) &&
             (bVar4 = str_cmp(local_2590->short_descr,local_2588->short_descr), !bVar4))) {
        local_49b0 = local_49b0 + 1;
        local_2590 = local_2590->next_content;
      }
      if (local_49b0 < local_49ac) {
        act((char *)CONCAT44(in_stack_ffffffffffffb5f4,in_stack_ffffffffffffb5f0),
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8),
            in_stack_ffffffffffffb5e0,
            (void *)CONCAT44(in_stack_ffffffffffffb5dc,in_stack_ffffffffffffb5d8),0);
        local_e0->reply = pCVar12;
        return;
      }
    }
    if (local_e0->gold < local_f8 * local_49ac) {
      if (local_49ac < 2) {
        act((char *)CONCAT44(in_stack_ffffffffffffb5f4,in_stack_ffffffffffffb5f0),
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8),
            in_stack_ffffffffffffb5e0,
            (void *)CONCAT44(in_stack_ffffffffffffb5dc,in_stack_ffffffffffffb5d8),0);
      }
      else {
        act((char *)CONCAT44(in_stack_ffffffffffffb5f4,in_stack_ffffffffffffb5f0),
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8),
            in_stack_ffffffffffffb5e0,
            (void *)CONCAT44(in_stack_ffffffffffffb5dc,in_stack_ffffffffffffb5d8),0);
      }
      local_e0->reply = pCVar12;
      return;
    }
    if (local_e0->level < local_2588->level) {
      act((char *)CONCAT44(in_stack_ffffffffffffb5f4,in_stack_ffffffffffffb5f0),
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8),
          in_stack_ffffffffffffb5e0,
          (void *)CONCAT44(in_stack_ffffffffffffb5dc,in_stack_ffffffffffffb5d8),0);
      local_e0->reply = pCVar12;
      return;
    }
    iVar6 = (int)local_e0->carry_number;
    iVar5 = local_49ac;
    iVar7 = get_obj_number(local_2588);
    iVar7 = iVar6 + iVar5 * iVar7;
    iVar8 = can_carry_n((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8));
    if (iVar8 < iVar7) {
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffb5f4,in_stack_ffffffffffffb5f0),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8));
      return;
    }
    iVar9 = (int)local_e0->carry_weight;
    iVar7 = local_49ac;
    iVar8 = get_obj_weight((OBJ_DATA *)in_stack_ffffffffffffb5e0);
    iVar9 = iVar9 + iVar7 * iVar8;
    iVar8 = can_carry_w((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8));
    if (iVar8 < iVar9) {
      send_to_char((char *)CONCAT44(iVar7,in_stack_ffffffffffffb5f0),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8));
      return;
    }
    bVar4 = check_benevolence((CHAR_DATA *)
                              CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8),
                              in_stack_ffffffffffffb5e0);
    if (bVar4) {
      local_f8 = local_f8 / 2;
    }
    local_ec = number_percent();
    local_49b1 = false;
    bVar4 = is_obj_stat((OBJ_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8),
                        (int)((ulong)in_stack_ffffffffffffb5e0 >> 0x20));
    if ((bVar4) ||
       (in_stack_ffffffffffffb5f0 = local_ec,
       iVar8 = get_skill(in_stack_ffffffffffffb6e0,in_stack_ffffffffffffb6dc),
       iVar8 <= in_stack_ffffffffffffb5f0)) {
      char_data::Profs(local_e0);
      local_49b1 = CProficiencies::HasProf
                             ((CProficiencies *)CONCAT44(iVar7,in_stack_ffffffffffffb5f0),
                              (char *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8))
      ;
      if (!local_49b1) goto LAB_0057cb7d;
    }
    iVar8 = get_skill(in_stack_ffffffffffffb6e0,in_stack_ffffffffffffb6dc);
    if (0x3c < iVar8) {
      local_f8 = local_f8 - ((local_2588->cost / 2) * local_ec) / 100;
    }
    if ((local_49b1 == false) || (local_f8 == 0)) {
      act((char *)CONCAT44(iVar7,in_stack_ffffffffffffb5f0),
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8),
          in_stack_ffffffffffffb5e0,
          (void *)CONCAT44(in_stack_ffffffffffffb5dc,in_stack_ffffffffffffb5d8),0);
    }
    else {
      in_stack_ffffffffffffb5ec = (float)local_f8;
      char_data::Profs(local_e0);
      fVar13 = CProficiencies::ProfEffect
                         ((CProficiencies *)
                          CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8),
                          (char *)in_stack_ffffffffffffb5e0,in_stack_ffffffffffffb5dc);
      dVar3 = std::floor((double)(ulong)(uint)((in_stack_ffffffffffffb5ec * fVar13) / 100.0));
      local_f8 = (long)SUB84(dVar3,0);
      sprintf(&stack0xffffffffffffb658,
              "Knowing it is inflated, you argue the price down to %ld coins.\n\r",local_f8);
      send_to_char((char *)CONCAT44(iVar7,in_stack_ffffffffffffb5f0),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8));
    }
    check_improve(in_stack_ffffffffffffb6c0,in_stack_ffffffffffffb6bc,
                  (bool)in_stack_ffffffffffffb6bb,in_stack_ffffffffffffb6b4);
LAB_0057cb7d:
    act((char *)CONCAT44(iVar7,in_stack_ffffffffffffb5f0),
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8),
        in_stack_ffffffffffffb5e0,
        (void *)CONCAT44(in_stack_ffffffffffffb5dc,in_stack_ffffffffffffb5d8),0);
    sprintf(&stack0xffffffffffffb658,"You hand $N %ld gold.",local_f8 * local_49ac);
    act((char *)CONCAT44(iVar7,in_stack_ffffffffffffb5f0),
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8),
        in_stack_ffffffffffffb5e0,
        (void *)CONCAT44(in_stack_ffffffffffffb5dc,in_stack_ffffffffffffb5d8),0);
    for (local_fc = 0; local_fc < local_49ac; local_fc = local_fc + 1) {
      act((char *)CONCAT44(iVar7,in_stack_ffffffffffffb5f0),
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8),
          in_stack_ffffffffffffb5e0,
          (void *)CONCAT44(in_stack_ffffffffffffb5dc,in_stack_ffffffffffffb5d8),0);
      act((char *)CONCAT44(iVar7,in_stack_ffffffffffffb5f0),
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8),
          in_stack_ffffffffffffb5e0,
          (void *)CONCAT44(in_stack_ffffffffffffb5dc,in_stack_ffffffffffffb5d8),0);
    }
    deduct_cost((CHAR_DATA *)CONCAT44(iVar7,in_stack_ffffffffffffb5f0),
                CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8));
    for (local_49b0 = 0; local_49b0 < local_49ac; local_49b0 = local_49b0 + 1) {
      obj_00 = (OBJ_DATA *)local_2588->extra_flags[0];
      _Var2 = std::pow<int,int>(0,0x57ccc1);
      if (((ulong)obj_00 & (long)_Var2) == 0) {
        local_2590 = local_2588;
        local_2588 = local_2588->next_content;
        obj_from_char((OBJ_DATA *)CONCAT44(iVar6,iVar5));
      }
      else {
        local_2590 = create_object(in_stack_ffffffffffffb690,in_stack_ffffffffffffb68c);
        if ((local_2588->item_type == 0xf) && (local_2588->contains != (OBJ_DATA *)0x0)) {
          for (local_25a0 = local_2588->contains; local_25a0 != (OBJ_DATA *)0x0;
              local_25a0 = local_25a0->next_content) {
            get_obj_index((int)in_stack_ffffffffffffb5ec);
            create_object(in_stack_ffffffffffffb690,in_stack_ffffffffffffb68c);
            obj_to_obj(obj_00,(OBJ_DATA *)
                              CONCAT44(in_stack_ffffffffffffb5dc,in_stack_ffffffffffffb5d8));
          }
        }
      }
      if (0 < local_2590->timer) {
        local_2590->timer = 0;
      }
      obj_to_char(obj_00,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5dc,in_stack_ffffffffffffb5d8))
      ;
      if (local_f8 < local_2590->cost) {
        local_2590->cost = (int)local_f8;
      }
    }
    return;
  }
  bVar4 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5dc,in_stack_ffffffffffffb5d8));
  if (bVar4) {
    return;
  }
  local_e8 = one_argument((char *)in_stack_ffffffffffffb5e0,
                          (char *)CONCAT44(in_stack_ffffffffffffb5dc,in_stack_ffffffffffffb5d8));
  local_2518 = get_room_index((int)in_stack_ffffffffffffb5ec);
  if (local_2518 == (ROOM_INDEX_DATA *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffb5f4,in_stack_ffffffffffffb5f0),
               (char *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8));
    fmt._M_str = in_stack_ffffffffffffb628;
    fmt._M_len = in_stack_ffffffffffffb620;
    CLogger::Debug<short&>
              ((CLogger *)in_stack_ffffffffffffb618,fmt,(short *)in_stack_ffffffffffffb610);
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffb5f4,in_stack_ffffffffffffb5f0),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8));
    return;
  }
  local_2520 = local_e0->in_room;
  local_e0->in_room = local_2518;
  local_2510 = get_char_room(in_stack_ffffffffffffc7e8,in_stack_ffffffffffffc7e0);
  local_e0->in_room = local_2520;
  if ((local_2510 == (CHAR_DATA *)0x0) ||
     (uVar1 = local_2510->act[0], _Var2 = std::pow<int,int>(0,0x57bdb9), (uVar1 & (long)_Var2) == 0)
     ) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffb5f4,in_stack_ffffffffffffb5f0),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8));
    return;
  }
  if (local_e0->pet != (CHAR_DATA *)0x0) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffb5f4,in_stack_ffffffffffffb5f0),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8));
    return;
  }
  local_f8 = (long)local_2510->level * 10 * (long)local_2510->level;
  if (local_e0->gold < local_f8) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffb5f4,in_stack_ffffffffffffb5f0),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8));
    return;
  }
  if (local_e0->level < local_2510->level) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffb5f4,in_stack_ffffffffffffb5f0),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8));
    return;
  }
  iVar5 = number_percent();
  local_2531 = 0;
  local_ec = iVar5;
  iVar6 = get_skill(in_stack_ffffffffffffb6e0,in_stack_ffffffffffffb6dc);
  if (iVar6 <= iVar5) {
    char_data::Profs(local_e0);
    local_2531 = CProficiencies::HasProf
                           ((CProficiencies *)
                            CONCAT44(in_stack_ffffffffffffb5f4,in_stack_ffffffffffffb5f0),
                            (char *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8));
    if (!(bool)local_2531) goto LAB_0057c068;
  }
  iVar5 = get_skill(in_stack_ffffffffffffb6e0,in_stack_ffffffffffffb6dc);
  if (0x3c < iVar5) {
    local_f8 = local_f8 - ((local_f8 / 3) * (long)local_ec) / 100;
  }
  sprintf(local_2508,"You haggle the price down to %ld coins.\n\r",local_f8);
  if (((local_2531 & 1) != 0) && (local_f8 != 0)) {
    fVar13 = (float)local_f8;
    char_data::Profs(local_e0);
    fVar14 = CProficiencies::ProfEffect
                       ((CProficiencies *)
                        CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8),
                        (char *)in_stack_ffffffffffffb5e0,in_stack_ffffffffffffb5dc);
    local_2538 = (fVar13 * fVar14) / 100.0;
    local_f8 = (long)(int)local_2538;
    sprintf(local_2508,"Knowing it is inflated, you argue the price down to %ld coins.\n\r",local_f8
           );
  }
  send_to_char((char *)CONCAT44(in_stack_ffffffffffffb5f4,in_stack_ffffffffffffb5f0),
               (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8));
  check_improve(in_stack_ffffffffffffb6c0,in_stack_ffffffffffffb6bc,(bool)in_stack_ffffffffffffb6bb,
                in_stack_ffffffffffffb6b4);
LAB_0057c068:
  deduct_cost((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5f4,in_stack_ffffffffffffb5f0),
              CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8));
  local_2510 = create_mobile((MOB_INDEX_DATA *)
                             CONCAT44(in_stack_ffffffffffffb6b4,in_stack_ffffffffffffb6b0));
  _Var2 = std::pow<int,int>(0,0x57c0a5);
  local_2510->act[0] = (long)_Var2 | local_2510->act[0];
  _Var2 = std::pow<int,int>(0,0x57c0cf);
  local_2510->affected_by[0] = (long)_Var2 | local_2510->affected_by[0];
  _Var2 = std::pow<int,int>(0,0x57c0f9);
  local_2510->comm[0] = (long)_Var2 | local_2510->comm[0];
  _Var2 = std::pow<int,int>(0,0x57c123);
  local_2510->comm[0] = (long)_Var2 | local_2510->comm[0];
  _Var2 = std::pow<int,int>(0,0x57c14d);
  local_2510->comm[0] = (long)_Var2 | local_2510->comm[0];
  local_e8 = one_argument((char *)in_stack_ffffffffffffb5e0,
                          (char *)CONCAT44(in_stack_ffffffffffffb5dc,in_stack_ffffffffffffb5d8));
  if (local_1308[0] != '\0') {
    ppacVar15 = &local_2568;
    local_70 = "{} {}";
    local_60 = "{} {}";
    local_2568 = (char (*) [4608])0x7eb971;
    local_68 = ppacVar15;
    local_58 = ppacVar15;
    pacVar10 = (char (*) [4608])std::char_traits<char>::length((char_type *)0x57c1fa);
    ppacVar15[1] = pacVar10;
    local_8 = local_70;
    local_90 = &local_2510->name;
    local_78 = local_2558;
    local_88 = local_2568;
    uStack_80 = local_2560;
    local_98 = (char **)local_1308;
    local_50 = &local_88;
    local_a8 = local_2568;
    __return_storage_ptr__ = &local_d8;
    local_48 = local_a8;
    ::fmt::v9::
    make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char*&,char(&)[4608]>
              (__return_storage_ptr__,(v9 *)local_90,local_98,local_2568);
    local_30 = &local_b8;
    local_20 = 0xcc;
    local_b8 = 0xcc;
    local_38 = __return_storage_ptr__;
    local_28 = __return_storage_ptr__;
    local_18 = local_30;
    local_10 = __return_storage_ptr__;
    local_b0 = __return_storage_ptr__;
    ::fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffb850,in_stack_ffffffffffffb840);
    free_pstring((char *)in_stack_ffffffffffffb5e0);
    std::__cxx11::string::c_str();
    in_stack_ffffffffffffb610 =
         (CHAR_DATA *)
         palloc_string((char *)CONCAT44(in_stack_ffffffffffffb60c,in_stack_ffffffffffffb608));
    local_2510->name = (char *)in_stack_ffffffffffffb610;
    std::__cxx11::string::~string(local_2558);
  }
  sprintf(local_2508,"%sA neck tag says \'I belong to %s\'.\n\r",local_2510->description,
          local_e0->name);
  free_pstring((char *)in_stack_ffffffffffffb5e0);
  pcVar11 = palloc_string((char *)CONCAT44(in_stack_ffffffffffffb60c,in_stack_ffffffffffffb608));
  local_2510->description = pcVar11;
  char_to_room(in_stack_ffffffffffffb610,
               (ROOM_INDEX_DATA *)CONCAT44(in_stack_ffffffffffffb60c,in_stack_ffffffffffffb608));
  add_follower(in_stack_ffffffffffffb660,in_stack_ffffffffffffb658);
  local_2510->leader = local_e0;
  local_e0->pet = local_2510;
  send_to_char((char *)CONCAT44(in_stack_ffffffffffffb5f4,in_stack_ffffffffffffb5f0),
               (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8));
  act((char *)CONCAT44(in_stack_ffffffffffffb5f4,in_stack_ffffffffffffb5f0),
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffb5ec,in_stack_ffffffffffffb5e8),
      in_stack_ffffffffffffb5e0,
      (void *)CONCAT44(in_stack_ffffffffffffb5dc,in_stack_ffffffffffffb5d8),0);
  return;
}

Assistant:

void do_buy(CHAR_DATA *ch, char *argument)
{
	int roll;
	long cost;
	int i;

	if (check_horde(ch))
	{
		send_to_char("You would never buy what can be be taken!\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		send_to_char("Buy what?\n\r", ch);
		return;
	}

	if (IS_SET(ch->in_room->room_flags, ROOM_PET_SHOP))
	{
		char arg[MAX_INPUT_LENGTH];
		char buf[MAX_STRING_LENGTH];
		CHAR_DATA *pet;
		ROOM_INDEX_DATA *pRoomIndexNext;
		ROOM_INDEX_DATA *in_room;

		if (is_npc(ch))
			return;

		argument = one_argument(argument, arg);

		/* hack to make new thalos pets work */
		pRoomIndexNext = get_room_index(ch->in_room->vnum + 1);
		if (pRoomIndexNext == nullptr)
		{
			RS.Logger.Debug("Do_buy: bad pet shop at vnum {}.", ch->in_room->vnum);
			send_to_char("Sorry, you can't buy that here.\n\r", ch);
			return;
		}

		in_room = ch->in_room;
		ch->in_room = pRoomIndexNext;
		pet = get_char_room(ch, arg);
		ch->in_room = in_room;

		if (pet == nullptr || !IS_SET(pet->act, ACT_PET))
		{
			send_to_char("Sorry, you can't buy that here.\n\r", ch);
			return;
		}

		if (ch->pet != nullptr)
		{
			send_to_char("You already own a pet.\n\r", ch);
			return;
		}

		cost = 10L * pet->level * pet->level;

		if (ch->gold < cost)
		{
			send_to_char("You can't afford it.\n\r", ch);
			return;
		}

		if (ch->level < pet->level)
		{
			send_to_char("You're not powerful enough to master this pet.\n\r", ch);
			return;
		}

		/* haggle */
		roll = number_percent();

		bool appraised= false;

		if (roll < get_skill(ch, gsn_haggle) || (appraised = ch->Profs()->HasProf("appraising")))
		{
			if (get_skill(ch, gsn_haggle) > 60)
				cost -= cost / 3 * roll / 100;

			sprintf(buf, "You haggle the price down to %ld coins.\n\r", cost);

			if (appraised && cost)
			{
				float mcost = cost * ch->Profs()->ProfEffect("appraising") / 100;
				cost = (int)mcost;

				sprintf(buf, "Knowing it is inflated, you argue the price down to %ld coins.\n\r", cost);
			}

			send_to_char(buf, ch);
			check_improve(ch, gsn_haggle, true, 4);
		}

		deduct_cost(ch, cost);

		pet = create_mobile(pet->pIndexData);

		SET_BIT(pet->act, ACT_PET);
		SET_BIT(pet->affected_by, AFF_CHARM);
		SET_BIT(pet->comm, COMM_NOTELL);
		SET_BIT(pet->comm, COMM_NOSHOUT);
		SET_BIT(pet->comm, COMM_NOCHANNELS);

		argument = one_argument(argument, arg);

		if (arg[0] != '\0')
		{
			auto buffer = fmt::format("{} {}", pet->name, arg);
			free_pstring(pet->name);
			pet->name = palloc_string(buffer.c_str()); // TODO: not sure what palloc_string does
		}

		sprintf(buf, "%sA neck tag says 'I belong to %s'.\n\r", pet->description, ch->name);

		free_pstring(pet->description);
		pet->description = palloc_string(buf);

		char_to_room(pet, ch->in_room);
		add_follower(pet, ch);

		pet->leader = ch;
		ch->pet = pet;

		send_to_char("Enjoy your pet.\n\r", ch);
		act("$n bought $N as a pet.", ch, nullptr, pet, TO_ROOM);
		return;
	}
	else
	{
		CHAR_DATA *keeper;
		OBJ_DATA *obj = nullptr, *t_obj = nullptr, *d_obj = nullptr, *c_obj = nullptr;
		char arg[MAX_INPUT_LENGTH], buf[MSL];
		int number = 1, count = 1;

		keeper = find_keeper(ch);

		if (keeper == nullptr)
			return;

		if (keeper == ch)
			return;

		argument = one_argument(argument, arg);

		if (argument[0] != '\0')
			number = atoi(argument);

		obj = get_obj_keeper(ch, keeper, arg);
		cost = get_cost(keeper, obj, true);

		if (number < 1)
		{
			interpret(keeper, "snort");
			return;
		}

		if (number > 9)
		{
			do_say(keeper, "I'm not selling you that many at once.");
			return;
		}

		if (cost <= 0 || !can_see_obj(ch, obj))
		{
			sprintf(buf, "%s I don't sell that, try 'list'ing to see what I do sell.", ch->name);
			do_tell(keeper, buf);
			return;
		}

		if (!is_obj_stat(obj, ITEM_INVENTORY))
		{
			for (t_obj = obj->next_content; count < number && t_obj != nullptr; t_obj = t_obj->next_content)
			{
				if (t_obj->pIndexData == obj->pIndexData && !str_cmp(t_obj->short_descr, obj->short_descr))
					count++;
				else
					break;
			}

			if (count < number)
			{
				act("$n tells you 'I don't have that many in stock.", keeper, nullptr, ch, TO_VICT);
				ch->reply = keeper;
				return;
			}
		}

		if (ch->gold < cost * number)
		{
			if (number > 1)
				act("$n tells you 'You can't afford to buy that many.", keeper, obj, ch, TO_VICT);
			else
				act("$n tells you 'You can't afford to buy $p'.", keeper, obj, ch, TO_VICT);

			ch->reply = keeper;
			return;
		}

		if (obj->level > ch->level)
		{
			act("$n tells you 'You can't use $p yet'.", keeper, obj, ch, TO_VICT);
			ch->reply = keeper;
			return;
		}

		if (ch->carry_number + number * get_obj_number(obj) > can_carry_n(ch))
		{
			send_to_char("You can't carry that many items.\n\r", ch);
			return;
		}

		if (ch->carry_weight + number * get_obj_weight(obj) > can_carry_w(ch))
		{
			send_to_char("You can't carry that much weight.\n\r", ch);
			return;
		}

		if (check_benevolence(ch, keeper))
			cost /= 2;

		/* haggle */

		roll = number_percent();
		bool appraised= false;

		if ((!is_obj_stat(obj, ITEM_SELL_EXTRACT) && roll < get_skill(ch, gsn_haggle))
			|| (appraised = ch->Profs()->HasProf("appraising")))
		{
			if (get_skill(ch, gsn_haggle) > 60)
				cost -= obj->cost / 2 * roll / 100;

			if (appraised && cost)
			{
				float mcost = floor(cost * ch->Profs()->ProfEffect("appraising") / 100);
				cost = static_cast<long>(mcost);
				sprintf(buf, "Knowing it is inflated, you argue the price down to %ld coins.\n\r", cost);
				send_to_char(buf, ch);
			}
			else
			{
				act("You haggle with $N.", ch, nullptr, keeper, TO_CHAR);
			}

			check_improve(ch, gsn_haggle, true, 4);
		}

		act("$n hands some gold to $N.", ch, 0, keeper, TO_ROOM);
		sprintf(buf, "You hand $N %ld gold.", cost * number);
		act(buf, ch, 0, keeper, TO_CHAR);

		for (i = 0; i < number; i++)
		{
			act("$N hands you $p.", ch, obj, keeper, TO_CHAR);
			act("$N hands $n $p.", ch, obj, keeper, TO_ROOM);
		}

		deduct_cost(ch, cost * number);

		for (count = 0; count < number; count++)
		{
			if (IS_SET(obj->extra_flags, ITEM_INVENTORY))
			{
				t_obj = create_object(obj->pIndexData, obj->level);

				if (obj->item_type == ITEM_CONTAINER && obj->contains)
				{
					for (c_obj = obj->contains; c_obj != nullptr; c_obj = c_obj->next_content)
					{
						d_obj = create_object(get_obj_index(c_obj->pIndexData->vnum), c_obj->level);
						obj_to_obj(d_obj, t_obj);
					}
				}
			}
			else
			{
				t_obj = obj;
				obj = obj->next_content;
				obj_from_char(t_obj);
			}

			if (t_obj->timer > 0)
				t_obj->timer = 0;

			obj_to_char(t_obj, ch);

			if (cost < t_obj->cost)
				t_obj->cost = cost;
		}
	}
}